

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  uint uVar4;
  int iVar5;
  U32 UVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  U32 UVar16;
  uint uVar17;
  
  uVar4 = 1 << ((byte)(params->cParams).windowLog & 0x1f);
  pBVar2 = (ms->window).base;
  iVar5 = (int)pBVar2;
  if (0xe0000000 < (uint)((int)iend - iVar5)) {
    uVar7 = 1 << ((char)(params->cParams).chainLog - (ZSTD_lazy2 < (params->cParams).strategy) &
                 0x1fU);
    uVar10 = (int)ip - iVar5;
    uVar11 = uVar7 - 1 & uVar10;
    uVar13 = 2;
    uVar14 = uVar13;
    if (2 < uVar7) {
      uVar14 = uVar7;
    }
    uVar8 = 0;
    if (uVar11 < 2) {
      uVar8 = uVar14;
    }
    uVar14 = uVar7;
    if (uVar7 <= uVar4) {
      uVar14 = uVar4;
    }
    uVar8 = uVar14 + uVar11 + uVar8;
    if (uVar11 != (uVar7 - 1 & uVar8)) {
      __assert_fail("(curr & cycleMask) == (newCurrent & cycleMask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x447,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar10 <= uVar8) {
      __assert_fail("curr > newCurrent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x448,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    uVar10 = uVar10 - uVar8;
    if (uVar10 < 0x10000001) {
      __assert_fail("correction > 1<<28",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,1099,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                   );
    }
    (ms->window).base = pBVar2 + uVar10;
    ppBVar1 = &(ms->window).dictBase;
    *ppBVar1 = *ppBVar1 + uVar10;
    uVar14 = (ms->window).dictLimit;
    uVar7 = (ms->window).lowLimit;
    uVar17 = uVar10 + 2;
    uVar11 = uVar7 - uVar10;
    if (uVar7 < uVar17) {
      uVar11 = uVar13;
    }
    uVar7 = uVar14 - uVar10;
    if (uVar14 < uVar17) {
      uVar7 = uVar13;
    }
    (ms->window).lowLimit = uVar11;
    (ms->window).dictLimit = uVar7;
    if (uVar8 < uVar4) {
      __assert_fail("newCurrent >= maxDist",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x45c,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar8 - uVar4 < 2) {
      __assert_fail("newCurrent - maxDist >= ZSTD_WINDOW_START_INDEX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x45d,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar8 < uVar11) {
      __assert_fail("window->lowLimit <= newCurrent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x45f,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar8 < uVar7) {
      __assert_fail("window->dictLimit <= newCurrent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x460,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    pUVar3 = &(ms->window).nbOverflowCorrections;
    *pUVar3 = *pUVar3 + 1;
    ZSTD_cwksp_mark_tables_dirty(ws);
    ZSTD_reduceTable(ms->hashTable,1 << ((byte)(params->cParams).hashLog & 0x1f),uVar10);
    iVar5 = ZSTD_allocateChainTable
                      ((params->cParams).strategy,params->useRowMatchFinder,ms->dedicatedDictSearch)
    ;
    if (iVar5 != 0) {
      uVar4 = (params->cParams).chainLog;
      UVar6 = 1 << ((byte)uVar4 & 0x1f);
      pUVar3 = ms->chainTable;
      if ((params->cParams).strategy == ZSTD_btlazy2) {
        iVar5 = 0x10;
        if (uVar4 < 4) {
          __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xa03,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        if (uVar4 == 0x1f) {
          __assert_fail("size < (1U<<31)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xa04,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        iVar12 = 0;
        for (iVar9 = 0; iVar9 != (int)UVar6 / 0x10; iVar9 = iVar9 + 1) {
          for (lVar15 = (long)iVar12; iVar5 != lVar15; lVar15 = lVar15 + 1) {
            uVar4 = pUVar3[lVar15];
            UVar16 = uVar4 - uVar10;
            if (uVar4 < uVar17) {
              UVar16 = 0;
            }
            if (uVar4 == 1) {
              UVar16 = 1;
            }
            pUVar3[lVar15] = UVar16;
          }
          iVar5 = iVar5 + 0x10;
          iVar12 = iVar12 + 0x10;
        }
      }
      else {
        ZSTD_reduceTable(pUVar3,UVar6,uVar10);
      }
    }
    if (ms->hashLog3 != 0) {
      ZSTD_reduceTable(ms->hashTable3,1 << ((byte)ms->hashLog3 & 0x1f),uVar10);
    }
    ZSTD_cwksp_mark_tables_clean(ws);
    UVar6 = ms->nextToUpdate - uVar10;
    if (ms->nextToUpdate < uVar10) {
      UVar6 = 0;
    }
    ms->nextToUpdate = UVar6;
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

static void ZSTD_overflowCorrectIfNeeded(ZSTD_matchState_t* ms,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         void const* ip,
                                         void const* iend)
{
    U32 const cycleLog = ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy);
    U32 const maxDist = (U32)1 << params->cParams.windowLog;
    if (ZSTD_window_needOverflowCorrection(ms->window, cycleLog, maxDist, ms->loadedDictEnd, ip, iend)) {
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
        ZSTD_cwksp_mark_tables_dirty(ws);
        ZSTD_reduceIndex(ms, params, correction);
        ZSTD_cwksp_mark_tables_clean(ws);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        /* invalidate dictionaries on overflow correction */
        ms->loadedDictEnd = 0;
        ms->dictMatchState = NULL;
    }
}